

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void C_ClearAliases(void)

{
  FConsoleCommand *pFVar1;
  int iVar2;
  FConsoleCommand *pFVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0xfb; lVar4 = lVar4 + 1) {
    pFVar1 = Commands[lVar4];
    while (pFVar3 = pFVar1, pFVar3 != (FConsoleCommand *)0x0) {
      pFVar1 = pFVar3->m_Next;
      iVar2 = (*pFVar3->_vptr_FConsoleCommand[2])(pFVar3);
      if ((char)iVar2 != '\0') {
        if (*(char *)((long)&pFVar3[1].m_Prev + 1) == '\0') {
          (*pFVar3->_vptr_FConsoleCommand[1])(pFVar3);
        }
        else {
          *(undefined1 *)((long)&pFVar3[1].m_Prev + 2) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void C_ClearAliases ()
{
	int bucket;
	FConsoleCommand *alias;

	for (bucket = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		alias = Commands[bucket];
		while (alias)
		{
			FConsoleCommand *next = alias->m_Next;
			if (alias->IsAlias())
				static_cast<FConsoleAlias *>(alias)->SafeDelete();
			alias = next;
		}
	}
}